

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugLoc.cpp
# Opt level: O0

LocationList * __thiscall
llvm::DWARFDebugLoc::getLocationListAtOffset(DWARFDebugLoc *this,uint64_t Offset)

{
  DWARFDebugLoc *pDVar1;
  const_iterator It;
  uint64_t Offset_local;
  DWARFDebugLoc *this_local;
  
  this_local = (DWARFDebugLoc *)
               partition_point<llvm::SmallVector<llvm::DWARFDebugLoc::LocationList,4u>const&,llvm::DWARFDebugLoc::getLocationListAtOffset(unsigned_long)const::__0,llvm::DWARFDebugLoc::LocationList_const&>
                         (&this->Locations,(anon_class_8_1_2dc041f1)Offset);
  pDVar1 = (DWARFDebugLoc *)
           SmallVectorTemplateCommon<llvm::DWARFDebugLoc::LocationList,_void>::end
                     ((SmallVectorTemplateCommon<llvm::DWARFDebugLoc::LocationList,_void> *)this);
  if ((this_local == pDVar1) ||
     ((this_local->Locations).super_SmallVectorImpl<llvm::DWARFDebugLoc::LocationList>.
      super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::LocationList,_false>.
      super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::LocationList,_void>.super_SmallVectorBase
      .BeginX != (void *)Offset)) {
    this_local = (DWARFDebugLoc *)0x0;
  }
  return (LocationList *)this_local;
}

Assistant:

DWARFDebugLoc::LocationList const *
DWARFDebugLoc::getLocationListAtOffset(uint64_t Offset) const {
  auto It = partition_point(
      Locations, [=](const LocationList &L) { return L.Offset < Offset; });
  if (It != Locations.end() && It->Offset == Offset)
    return &(*It);
  return nullptr;
}